

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

bool __thiscall Parse::SMTLIB2::parseAsSortDefinition(SMTLIB2 *this,string *id,LExpr *exp)

{
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> elem;
  pair<Kernel::TermList,_Kernel::TermList> val;
  bool bVar1;
  undefined1 uVar2;
  SortDefinition *pSVar3;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  undefined8 extraout_RAX;
  TermList TVar4;
  Expression *pEVar5;
  long in_RDI;
  pair<Kernel::TermList,_Kernel::TermList> pVar6;
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> pVar7;
  string *argName;
  TermList arg;
  LispListReader argRdr;
  TermLookup *lookup;
  SortDefinition *def;
  string pId;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffdb8;
  ParseResult *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  TermList in_stack_fffffffffffffdd8;
  TermList in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  TermList in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  TermList in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe18;
  pair<Parse::SMTLIB2::ParseOperation,_std::nullptr_t> local_180;
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> local_170;
  uint64_t local_160;
  pair<Kernel::TermList,_Kernel::TermList> local_158;
  string local_148 [32];
  string local_128 [32];
  string *local_108;
  TermList in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  SMTLIB2 *in_stack_ffffffffffffff10;
  TermList local_c0;
  TermList local_b8 [7];
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_80;
  undefined4 local_78;
  undefined8 local_70;
  string local_68 [32];
  SortDefinition *local_48;
  string local_40 [63];
  byte local_1;
  
  std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0._content);
  std::__cxx11::string::string(local_68,local_40);
  pSVar3 = Lib::
           DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parse::SMTLIB2::SortDefinition,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findPtr((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parse::SMTLIB2::SortDefinition,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_68);
  local_48 = pSVar3;
  if (pSVar3 == (SortDefinition *)0x0) {
    local_1 = 0;
  }
  else {
    this_00 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)Lib::
                 DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                 ::operator_new(0xa5f746);
    Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::DHMap(this_00);
    local_80 = this_00;
    Shell::LispListReader::LispListReader
              ((LispListReader *)in_stack_fffffffffffffdc0,(LExprList *)in_stack_fffffffffffffdb8);
    pVar6.second._content = in_stack_fffffffffffffdd8._content;
    pVar6.first._content = in_stack_fffffffffffffde0._content;
    while( true ) {
      bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa5f78f);
      if (!bVar1) break;
      bVar1 = Lib::Stack<Parse::SMTLIB2::ParseResult>::isEmpty
                        ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      if (bVar1) {
LAB_00a5f7fe:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe00._content,
                   (char *)CONCAT17(in_stack_fffffffffffffdff,
                                    CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
                   (allocator<char> *)in_stack_fffffffffffffdf0._content);
        complainAboutArgShortageOrWrongSorts
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (LExpr *)in_stack_ffffffffffffff00._content);
      }
      Lib::Stack<Parse::SMTLIB2::ParseResult>::top
                ((Stack<Parse::SMTLIB2::ParseResult> *)(in_RDI + 200));
      uVar2 = ParseResult::isSeparator(in_stack_fffffffffffffdc0);
      if ((bool)uVar2) goto LAB_00a5f7fe;
      Kernel::TermList::TermList(local_b8);
      Lib::Stack<Parse::SMTLIB2::ParseResult>::pop
                ((Stack<Parse::SMTLIB2::ParseResult> *)pVar6.second._content._content);
      local_c0 = ParseResult::asTerm((ParseResult *)
                                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                                     &in_stack_fffffffffffffdc0->sort);
      in_stack_fffffffffffffe00 = Kernel::AtomicSort::superSort();
      in_stack_ffffffffffffff00 = in_stack_fffffffffffffe00;
      in_stack_fffffffffffffdff =
           Kernel::TermList::operator==(&local_c0,(TermList *)&stack0xffffffffffffff00);
      in_stack_fffffffffffffdfe = in_stack_fffffffffffffdff ^ 0xff;
      ParseResult::~ParseResult((ParseResult *)0xa5f95c);
      local_70 = CONCAT71((int7)((ulong)extraout_RAX >> 8),in_stack_fffffffffffffdfe);
      if ((in_stack_fffffffffffffdfe & 1) != 0) {
        ParseResult::~ParseResult((ParseResult *)0xa5f987);
        std::__cxx11::string::~string(local_40);
        _Unwind_Resume(local_70);
      }
      Shell::LispListReader::readAtom_abi_cxx11_
                ((LispListReader *)CONCAT17(uVar2,in_stack_fffffffffffffe18));
      local_108 = local_128;
      in_stack_fffffffffffffdf0._content = (uint64_t)local_80;
      std::__cxx11::string::string(local_148,local_108);
      TVar4 = Kernel::AtomicSort::superSort();
      local_160 = TVar4._content;
      pVar6 = std::make_pair<Kernel::TermList&,Kernel::TermList>
                        (&in_stack_fffffffffffffdc0->sort,(TermList *)in_stack_fffffffffffffdb8);
      val.second._content = in_stack_fffffffffffffdf0._content;
      val.first._content = TVar4._content;
      local_158 = pVar6;
      Lib::
      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)pVar6.first._content._content,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pVar6.second._content._content,val);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_128);
    }
    Lib::
    Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
    ::push((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
            *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    pEVar5 = (Expression *)(in_RDI + 0xe8);
    std::make_pair<Parse::SMTLIB2::ParseOperation,decltype(nullptr)>
              ((ParseOperation *)in_stack_fffffffffffffdc0,(void **)in_stack_fffffffffffffdb8);
    std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>::
    pair<Parse::SMTLIB2::ParseOperation,_std::nullptr_t,_true>(&local_170,&local_180);
    pVar7._4_4_ = in_stack_fffffffffffffdcc;
    pVar7.first = in_stack_fffffffffffffdc8;
    pVar7.second = pEVar5;
    Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::push
              ((Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_> *
               )in_stack_fffffffffffffdc0,pVar7);
    pVar7 = std::make_pair<Parse::SMTLIB2::ParseOperation,Shell::LispParser::Expression*&>
                      ((ParseOperation *)in_stack_fffffffffffffdc0,(Expression **)(in_RDI + 0xe8));
    elem._4_4_ = pVar7.first;
    elem.first = in_stack_fffffffffffffdc8;
    elem.second = pEVar5;
    Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::push
              ((Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_> *
               )pVar7.second,elem);
    local_1 = 1;
  }
  local_78 = 1;
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool SMTLIB2::parseAsSortDefinition(const std::string& id,LExpr* exp)
{
  std::string pId = id + TYPECON_POSTFIX;
  auto def = _sortDefinitions.findPtr(pId);
  if (!def) {
    return false;
  }
  TermLookup* lookup = new TermLookup();

  LispListReader argRdr(def->args);

  while (argRdr.hasNext()) {
    if (_results.isEmpty() || _results.top().isSeparator()) {
      complainAboutArgShortageOrWrongSorts("sort definition",exp);
    }
    TermList arg;
    ALWAYS(_results.pop().asTerm(arg) == AtomicSort::superSort());
    const std::string& argName = argRdr.readAtom();
    // TODO: could check if the same string names more than one argument positions
    // the following just takes the first and ignores the others
    lookup->insert(argName,make_pair(arg,AtomicSort::superSort()));
  }

  _scopes.push(lookup);

  _todo.push(make_pair(PO_POP_LOOKUP,nullptr)); //schedule lookup deletion (see above)
  _todo.push(make_pair(PO_PARSE_SORT,def->body));

  return true;
}